

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtc.c
# Opt level: O2

void gba_rtc_write(gpio_port_t value,uint8_t mask)

{
  uint8_t *puVar1;
  uint64_t *puVar2;
  uint8_t uVar3;
  gbabus_t *pgVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  
  pgVar4 = bus;
  if (1 < gba_log_verbosity) {
    printf("\x1b[0;36m[INFO]  state: %d SCK: %d SIO: %d CS: %d\n\x1b[0;m",(ulong)(bus->rtc).state,
           (ulong)(value.raw & 1),(ulong)(value.raw >> 1 & 1),(ulong)(value.raw >> 2 & 1));
  }
  switch((pgVar4->rtc).state) {
  case RTC_READY:
    (pgVar4->rtc).command_buffer = '\0';
    (pgVar4->rtc).current_command_bit = 0;
    bVar5 = value.raw >> 2 & 1;
    if (((value.raw >> 2 & 1) == 0) && ((value.raw & 1) != 0)) goto LAB_0011d0eb;
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c",
            0x8a);
    uVar7 = (ulong)(value.raw & 1);
    pcVar8 = "Unhandled CS: %d SCK: %d combination in READY state\n\x1b[0;m";
    break;
  case RTC_COMMAND_MODE_1:
    if (((value.raw & 4) != 0) && ((value.raw & 1) != 0)) {
      (pgVar4->rtc).state = RTC_COMMAND_MODE_2;
      goto LAB_0011d27b;
    }
    if (gba_log_verbosity != 0) {
      printf("\x1b[0;33m[WARN]  Unhandled CS: %d SCK: %d combination in RTC_COMMAND_MODE_1 state\n\x1b[0;m"
             ,(ulong)((value.raw & 4) >> 2),(ulong)(value.raw & 1));
    }
LAB_0011d0eb:
    (pgVar4->rtc).state = RTC_COMMAND_MODE_1;
LAB_0011d27b:
    (bus->port).raw = ~mask & (bus->port).raw | value.raw;
    return;
  case RTC_COMMAND_MODE_2:
    if ((value.raw & 5) == 4) {
      puVar1 = &(pgVar4->rtc).command_buffer;
      *puVar1 = *puVar1 | (value.raw >> 1 & 1) << ((byte)(pgVar4->rtc).current_command_bit & 0x1f);
      goto LAB_0011d27b;
    }
    if (((value.raw & 4) == 0) || ((value.raw & 1) == 0)) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c",
              0xaa);
      fprintf(_stderr,
              "Unhandled CS: %d SCK: %d combination in RTC_COMMAND_MODE_2 state (command 0x%02X)\n\x1b[0;m"
              ,(ulong)((value.raw & 4) >> 2),(ulong)(value.raw & 1),
              (ulong)(pgVar4->rtc).command_buffer);
      goto LAB_0011d3dd;
    }
    iVar6 = (pgVar4->rtc).current_command_bit;
    bVar5 = (value.raw >> 1 & 1) << ((byte)iVar6 & 0x1f) | (pgVar4->rtc).command_buffer;
    (pgVar4->rtc).command_buffer = bVar5;
    iVar6 = iVar6 + 1;
    (pgVar4->rtc).current_command_bit = iVar6;
    if (iVar6 != 8) goto LAB_0011d27b;
    if ((bVar5 & 0xf0) == 0x60) {
      bVar5 = bVar5 << 4 | bVar5 >> 4;
      bVar5 = bVar5 >> 2 & 0x33 | (bVar5 & 0x33) << 2;
      (pgVar4->rtc).command_buffer = bVar5 >> 1 & 0x55 | (bVar5 & 0x55) * '\x02';
      if (2 < gba_log_verbosity) {
        pcVar8 = "[DEBUG] [GPIO] [RTC] Need to reverse the command.";
LAB_0011d2b1:
        puts(pcVar8);
      }
    }
    else if (((bVar5 & 0xf) == 6) && (2 < gba_log_verbosity)) {
      pcVar8 = "[DEBUG] [GPIO] [RTC] Already got the command in a good order.";
      goto LAB_0011d2b1;
    }
    run_command((pgVar4->rtc).command_buffer >> 4);
    goto LAB_0011d27b;
  case RTC_DATA_READ:
    if ((value.raw & 4) != 0) {
      bVar9 = (value.raw & 1) == 0;
      if (bVar9) {
        if (!bVar9) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c"
                  ,0xb9);
          fprintf(_stderr,"Unhandled CS: %d SCK: %d combination in RTC_DATA_READ\n\x1b[0;m",1,1);
          exit(1);
        }
      }
      else if (((bus->port).raw & 1) == 0) {
        (bus->port).raw = (bus->port).raw & 0xfc | (char)(pgVar4->rtc).buffer * '\x02' & 2U;
        puVar2 = &(pgVar4->rtc).buffer;
        *puVar2 = *puVar2 >> 1;
      }
      goto LAB_0011d27b;
    }
LAB_0011d273:
    (pgVar4->rtc).state = RTC_READY;
    goto LAB_0011d27b;
  case RTC_DATA_WRITE:
    if ((value.raw & 4) == 0) {
      if ((value.raw & 1) != 0) {
        uVar3 = (pgVar4->rtc).reg;
        if (uVar3 == '\x04') {
          bVar5 = (byte)(pgVar4->rtc).buffer;
          bVar5 = bVar5 << 4 | bVar5 >> 4;
          bVar5 = bVar5 >> 2 & 0x33 | (bVar5 & 0x33) << 2;
          bVar5 = bVar5 >> 1 & 0x55 | (bVar5 & 0x55) * '\x02';
          (pgVar4->rtc).control_reg.raw = bVar5;
          printf("Control reg is now: 0x%02X\n",(ulong)bVar5);
        }
        else {
          if (uVar3 != '\0') {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c"
                    ,0xc9);
            uVar7 = (ulong)(pgVar4->rtc).reg;
            pcVar8 = "Wrote to unknown register: %d\n\x1b[0;m";
            goto LAB_0011d3d6;
          }
          puts("RESET");
          (pgVar4->rtc).buffer = 0;
          (pgVar4->rtc).control_reg.raw = '\0';
        }
        goto LAB_0011d273;
      }
      uVar7 = (ulong)(value.raw & 1);
    }
    else {
      bVar9 = (value.raw & 1) != 0;
      if (bVar9) {
        (pgVar4->rtc).buffer = (pgVar4->rtc).buffer * 2 & (pgVar4->rtc).write_mask;
        goto LAB_0011d27b;
      }
      if (!bVar9) {
        (pgVar4->rtc).buffer =
             (ulong)(value.raw >> 1) & 1 | (pgVar4->rtc).buffer & 0xfffffffffffffffe;
        printf("RTC write buffer: 0x%lX\n");
        goto LAB_0011d27b;
      }
      uVar7 = 1;
    }
    bVar5 = (value.raw & 4) >> 2;
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c",
            0xd4);
    pcVar8 = "Unhandled CS: %d SCK: %d combination in RTC_DATA_WRITE\n\x1b[0;m";
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c",
            0xd8);
    uVar7 = (ulong)(pgVar4->rtc).state;
    pcVar8 = "Write to GPIO while in unknown state: %d\n\x1b[0;m";
LAB_0011d3d6:
    fprintf(_stderr,pcVar8,uVar7);
    goto LAB_0011d3dd;
  }
  fprintf(_stderr,pcVar8,(ulong)bVar5,uVar7);
LAB_0011d3dd:
  exit(1);
}

Assistant:

void gba_rtc_write(gpio_port_t value, byte mask) {
    rtc_t* rtc = &bus->rtc;
    loginfo("state: %d SCK: %d SIO: %d CS: %d", rtc->state, value.rtc_sck, value.rtc_sio, value.rtc_cs);

    switch (rtc->state) {
        case RTC_READY:
            rtc->command_buffer = 0;
            rtc->current_command_bit = 0;
            if (value.rtc_cs == 0 && value.rtc_sck == 1) {
                rtc->state = RTC_COMMAND_MODE_1;
            } else {
                logfatal("Unhandled CS: %d SCK: %d combination in READY state", value.rtc_cs, value.rtc_sck)
            }
            break;
        case RTC_COMMAND_MODE_1:
            if (value.rtc_cs == 1 && value.rtc_sck == 1) {
                rtc->state = RTC_COMMAND_MODE_2;
            } else {
                logwarn("Unhandled CS: %d SCK: %d combination in RTC_COMMAND_MODE_1 state", value.rtc_cs, value.rtc_sck)
                rtc->state = RTC_COMMAND_MODE_1;
            }
            break;
        case RTC_COMMAND_MODE_2:
            if (value.rtc_cs == 1 && value.rtc_sck == 0) {
                byte bit = value.rtc_sio & 1;
                rtc->command_buffer &= ~(bit << rtc->current_command_bit);
                rtc->command_buffer |= (bit << rtc->current_command_bit);
            } else if (value.rtc_cs == 1 && value.rtc_sck == 1) {
                byte bit = value.rtc_sio & 1;
                rtc->command_buffer &= ~(bit << rtc->current_command_bit);
                rtc->command_buffer |= (bit << rtc->current_command_bit);
                if (++rtc->current_command_bit == 8) {
                    if ((rtc->command_buffer >> 4) == 6) {
                        rtc->command_buffer = reverse(rtc->command_buffer);
                        logdebug("[GPIO] [RTC] Need to reverse the command.");
                    } else if ((rtc->command_buffer & 0xF) == 6) {
                        logdebug("[GPIO] [RTC] Already got the command in a good order.");
                    }
                    // Command passed validity check and is now in the correct order. Command is in the upper 4 bits,
                    // Lower 4 are always a 6.
                    run_command((rtc->command_buffer >> 4) & 0xF);
                }
            } else {
                logfatal("Unhandled CS: %d SCK: %d combination in RTC_COMMAND_MODE_2 state (command 0x%02X)", value.rtc_cs, value.rtc_sck, rtc->command_buffer)
            }
            break;
        case RTC_DATA_READ:
            if (value.rtc_cs == 1 && value.rtc_sck == 1) {
                // If the value here used to be 0, send the next data bit
                if (bus->port.rtc_sck == 0) {
                    bus->port.rtc_sio = rtc->buffer & 1;
                    rtc->buffer >>= 1;
                }
            } else if (value.rtc_cs == 1 && value.rtc_sck == 0) {
                // Ignore
            } else if (value.rtc_cs == 0) {
                rtc->state = RTC_READY;
            } else {
                logfatal("Unhandled CS: %d SCK: %d combination in RTC_DATA_READ", value.rtc_cs, value.rtc_sck)
            }
            break;
        case RTC_DATA_WRITE:
            if (value.rtc_cs == 0 && value.rtc_sck == 1) {
                switch (rtc->reg) {
                    case RESET_REG:
                        printf("RESET\n");
                        rtc->buffer = 0;
                        rtc->control_reg.raw = 0;
                        break;
                    case CONTROL_REG:
                        rtc->control_reg.raw = reverse(rtc->buffer & 0xFF);
                        printf("Control reg is now: 0x%02X\n", rtc->control_reg.raw);
                        break;
                    default:
                        logfatal("Wrote to unknown register: %d", rtc->reg)
                }
                rtc->state = RTC_READY;
            } else if (value.rtc_cs == 1 && value.rtc_sck == 1) {
                rtc->buffer <<= 1;
                rtc->buffer &= rtc->write_mask;
            } else if (value.rtc_cs == 1 && value.rtc_sck == 0) {
                rtc->buffer &= 0xFFFFFFFFFFFFFFFE;
                rtc->buffer |= (value.rtc_sio & 1);
                printf("RTC write buffer: 0x%lX\n", rtc->buffer);
            } else {
                logfatal("Unhandled CS: %d SCK: %d combination in RTC_DATA_WRITE", value.rtc_cs, value.rtc_sck)
            }
            break;
        default:
            logfatal("Write to GPIO while in unknown state: %d", rtc->state)
    }

    bus->port.raw &= ~mask;
    bus->port.raw |= value.raw;
}